

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFOutlineObjectHelper.cc
# Opt level: O1

void __thiscall
QPDFOutlineObjectHelper::QPDFOutlineObjectHelper
          (QPDFOutlineObjectHelper *this,QPDFObjectHandle *a_oh,QPDFOutlineDocumentHelper *dh,
          int depth)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  QPDFOutlineDocumentHelper *pQVar4;
  size_type this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  bool bVar6;
  Members *__p;
  QPDFObjGen QVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  QPDFOutlineObjectHelper *__tmp;
  QPDFObjectHandle cur;
  QPDFOutlineObjectHelper new_ooh;
  set children;
  string local_f8;
  QPDFObjectHandle local_d8;
  QPDFObjectHandle local_c8;
  long *local_b8 [2];
  long local_a8 [2];
  QPDFOutlineObjectHelper local_98;
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  local_60;
  
  peVar2 = (a_oh->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var3 = (a_oh->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  local_f8.field_2._8_8_ = dh;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
      (this->super_QPDFObjectHelper).super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
      (this->super_QPDFObjectHelper).super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3;
      (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper =
           (_func_int **)&PTR__QPDFObjectHelper_002f1ce8;
      (this->super_QPDFObjectHelper).oh_.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      (this->super_QPDFObjectHelper).oh_.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      goto LAB_001d1082;
    }
  }
  (this->super_QPDFObjectHelper).super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->super_QPDFObjectHelper).super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3;
  (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper =
       (_func_int **)&PTR__QPDFObjectHelper_002f1ce8;
  (this->super_QPDFObjectHelper).oh_.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_QPDFObjectHelper).oh_.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_001d1082:
  (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper =
       (_func_int **)&PTR__QPDFOutlineObjectHelper_002f1d40;
  __p = (Members *)operator_new(0x30);
  __p->dh = (QPDFOutlineDocumentHelper *)local_f8.field_2._8_8_;
  (__p->parent).super___shared_ptr<QPDFOutlineObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->parent).super___shared_ptr<QPDFOutlineObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__p->kids).super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->kids).super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->kids).super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m).super___shared_ptr<QPDFOutlineObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = __p;
  this_00 = &(this->m).
             super___shared_ptr<QPDFOutlineObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<QPDFOutlineObjectHelper::Members*>
            (this_00,__p);
  if (depth < 0x33) {
    pQVar4 = ((this->m).
              super___shared_ptr<QPDFOutlineObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->dh;
    QVar7 = QPDFObjectHandle::getObjGen(a_oh);
    bVar6 = QPDFObjGen::set::add
                      (&((pQVar4->m).
                         super___shared_ptr<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->seen,QVar7);
    if (bVar6) {
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_60._M_impl.super__Rb_tree_header._M_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      p_Var1 = &local_98.super_QPDFObjectHelper.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      local_f8.field_2._M_allocated_capacity = (size_type)this_00;
      local_98.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var1;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"/First","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_f8,(string *)a_oh);
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          local_98.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var1) {
        operator_delete(local_98.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                        (ulong)((long)&(local_98.super_QPDFObjectHelper.super_BaseHandle.obj.
                                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
      }
      while( true ) {
        bVar6 = QPDFObjectHandle::isNull((QPDFObjectHandle *)&local_f8);
        if (bVar6) break;
        bVar6 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)&local_f8);
        if (!bVar6) break;
        QVar7 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)&local_f8);
        bVar6 = QPDFObjGen::set::add((set *)&local_60,QVar7);
        if (!bVar6) break;
        local_d8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)local_f8._M_dataplus._M_p;
        local_d8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_f8._M_string_length + 8) =
                 *(_Atomic_word *)(local_f8._M_string_length + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_f8._M_string_length + 8) =
                 *(_Atomic_word *)(local_f8._M_string_length + 8) + 1;
          }
        }
        QPDFOutlineObjectHelper
                  (&local_98,&local_d8,(QPDFOutlineDocumentHelper *)local_f8.field_2._8_8_,depth + 1
                  );
        if (local_d8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_d8.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
        p_Var8->_M_use_count = 1;
        p_Var8->_M_weak_count = 1;
        p_Var8->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002f1e18;
        __gnu_cxx::new_allocator<QPDFOutlineObjectHelper>::
        construct<QPDFOutlineObjectHelper,QPDFOutlineObjectHelper&>
                  ((new_allocator<QPDFOutlineObjectHelper> *)local_b8,
                   (QPDFOutlineObjectHelper *)(p_Var8 + 1),this);
        ((local_98.m.
          super___shared_ptr<QPDFOutlineObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        parent).super___shared_ptr<QPDFOutlineObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (QPDFOutlineObjectHelper *)(p_Var8 + 1);
        p_Var3 = ((local_98.m.
                   super___shared_ptr<QPDFOutlineObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->parent).
                 super___shared_ptr<QPDFOutlineObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi;
        ((local_98.m.
          super___shared_ptr<QPDFOutlineObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        parent).super___shared_ptr<QPDFOutlineObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = p_Var8;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
        std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::push_back
                  (&((this->m).
                     super___shared_ptr<QPDFOutlineObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->kids,&local_98);
        local_b8[0] = local_a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"/Next","");
        QPDFObjectHandle::getKey(&local_c8,&local_f8);
        _Var5._M_pi = local_c8.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        local_f8._M_dataplus._M_p =
             (pointer)local_c8.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        this_01 = local_f8._M_string_length;
        local_c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        local_c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_f8._M_string_length = (size_type)_Var5._M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
        }
        if (local_c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_c8.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        if (local_b8[0] != local_a8) {
          operator_delete(local_b8[0],local_a8[0] + 1);
        }
        ~QPDFOutlineObjectHelper(&local_98);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length);
      }
      std::
      _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
      ::~_Rb_tree(&local_60);
    }
  }
  return;
}

Assistant:

QPDFOutlineObjectHelper::QPDFOutlineObjectHelper(
    QPDFObjectHandle a_oh, QPDFOutlineDocumentHelper& dh, int depth) :
    QPDFObjectHelper(a_oh),
    m(new Members(dh))
{
    if (depth > 50) {
        // Not exercised in test suite, but was tested manually by temporarily changing max depth
        // to 1.
        return;
    }
    if (QPDFOutlineDocumentHelper::Accessor::checkSeen(m->dh, a_oh.getObjGen())) {
        QTC::TC("qpdf", "QPDFOutlineObjectHelper loop");
        return;
    }

    QPDFObjGen::set children;
    QPDFObjectHandle cur = a_oh.getKey("/First");
    while (!cur.isNull() && cur.isIndirect() && children.add(cur)) {
        QPDFOutlineObjectHelper new_ooh(cur, dh, 1 + depth);
        new_ooh.m->parent = std::make_shared<QPDFOutlineObjectHelper>(*this);
        m->kids.push_back(new_ooh);
        cur = cur.getKey("/Next");
    }
}